

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_001673d8;
  (this->m_wildcardPattern)._vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_001673b0;
  pcVar2 = (this->m_wildcardPattern).m_pattern._M_dataplus._M_p;
  paVar1 = &(this->m_wildcardPattern).m_pattern.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}